

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzellipse3d.cpp
# Opt level: O2

void __thiscall
pzgeom::TPZEllipse3D::GradX<double>
          (TPZEllipse3D *this,TPZFMatrix<double> *cornerco,TPZVec<double> *par,
          TPZFMatrix<double> *gradx)

{
  double dVar1;
  double *pdVar2;
  int j;
  long col;
  int i_1;
  int i;
  long lVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  TPZFMatrix<double> axloc;
  TPZFNMatrix<3,_double> dxcoglob;
  TPZFNMatrix<3,_double> dxcoloc;
  
  dVar4 = this->fAngleIni;
  dVar6 = this->fAngleFinal;
  dVar1 = *par->fStore;
  dxcoglob.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)0x0;
  TPZFNMatrix<3,_double>::TPZFNMatrix(&dxcoloc,3,1,(double *)&dxcoglob);
  axloc.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)0x0;
  TPZFNMatrix<3,_double>::TPZFNMatrix(&dxcoglob,3,1,(double *)&axloc);
  dVar6 = dVar6 - dVar4;
  dVar4 = (dVar1 + 1.0) * 0.5 * dVar6 + dVar4;
  dVar1 = this->fsAxeX;
  dVar5 = sin(dVar4);
  pdVar2 = TPZFMatrix<double>::operator()(&dxcoloc.super_TPZFMatrix<double>,0,0);
  *pdVar2 = dVar5 * -dVar1;
  dVar1 = this->fsAxeY;
  dVar4 = cos(dVar4);
  pdVar2 = TPZFMatrix<double>::operator()(&dxcoloc.super_TPZFMatrix<double>,1,0);
  *pdVar2 = dVar1 * dVar4;
  TPZFMatrix<double>::TPZFMatrix(&axloc,3,3);
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    for (col = 0; col != 3; col = col + 1) {
      dVar4 = (this->fAxes).super_TPZFMatrix<double>.fElem
              [(this->fAxes).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.
               fRow * col + lVar3];
      pdVar2 = TPZFMatrix<double>::operator()(&axloc,lVar3,col);
      *pdVar2 = dVar4;
    }
  }
  TPZFMatrix<double>::MultAdd
            (&axloc,&dxcoloc.super_TPZFMatrix<double>,&dxcoloc.super_TPZFMatrix<double>,
             &dxcoglob.super_TPZFMatrix<double>,1.0,0.0,1);
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    pdVar2 = TPZFMatrix<double>::operator()(&dxcoglob.super_TPZFMatrix<double>,lVar3,0);
    dVar4 = *pdVar2;
    pdVar2 = TPZFMatrix<double>::operator()(gradx,lVar3,0);
    *pdVar2 = dVar4 * dVar6 * 0.5;
  }
  TPZFMatrix<double>::~TPZFMatrix(&axloc);
  TPZFNMatrix<3,_double>::~TPZFNMatrix(&dxcoglob);
  TPZFNMatrix<3,_double>::~TPZFNMatrix(&dxcoloc);
  return;
}

Assistant:

void TPZEllipse3D::GradX(TPZFMatrix<REAL> &cornerco, TPZVec<T> &par, TPZFMatrix<T> &gradx) const
{
    REAL delangle = fAngleFinal - fAngleIni;
    T dangledqsi = 1./2.*delangle;
    T angle = fAngleIni + (par[0]+1.)/2.*delangle;
    TPZFNMatrix<3,T> dxcoloc(3,1,0.),dxcoglob(3,1,0.);
    dxcoloc(0,0) = -fsAxeX*sin(angle);
    dxcoloc(1,0) = fsAxeY*cos(angle);
    int transp = 1;
    TPZFMatrix<T> axloc(3,3);
    for (int i=0; i<3; i++) {
        for (int j=0; j<3; j++) {
            axloc(i,j) = fAxes.GetVal(i,j);
        }
    }
    axloc.MultAdd(dxcoloc, dxcoloc, dxcoglob,1.,0.,transp);
    for (int i=0; i<3; i++) {
        gradx(i,0) = dangledqsi*dxcoglob(i,0);
    }

}